

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O2

void __thiscall
spdlog::sinks::
daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::daily_filename_calculator>::
daily_file_sink(daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::daily_filename_calculator>
                *this,filename_t *base_filename,int rotation_hour,int rotation_minute,bool truncate,
               uint16_t max_files,file_event_handlers *event_handlers)

{
  time_point tVar1;
  filename_t filename;
  filename_t local_a8;
  string local_88;
  tm local_68;
  
  base_sink<spdlog::details::null_mutex>::base_sink
            (&this->super_base_sink<spdlog::details::null_mutex>);
  (this->super_base_sink<spdlog::details::null_mutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__daily_file_sink_0019bb90;
  std::__cxx11::string::string((string *)&this->base_filename_,(string *)base_filename);
  this->rotation_h_ = rotation_hour;
  this->rotation_m_ = rotation_minute;
  (this->rotation_tp_).__d.__r = 0;
  details::file_helper::file_helper(&this->file_helper_,event_handlers);
  this->truncate_ = truncate;
  this->max_files_ = max_files;
  (this->filenames_q_).v_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filenames_q_).max_items_ = 0;
  (this->filenames_q_).head_ = 0;
  (this->filenames_q_).tail_ = 0;
  (this->filenames_q_).overrun_counter_ = 0;
  (this->filenames_q_).v_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filenames_q_).v_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((uint)rotation_hour < 0x18) && ((uint)rotation_minute < 0x3c)) {
    tVar1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    now_tm(&local_68,this,tVar1);
    daily_filename_calculator::calc_filename(&local_a8,&this->base_filename_,&local_68);
    details::file_helper::open(&this->file_helper_,(char *)&local_a8,(uint)this->truncate_);
    tVar1 = next_rotation_tp_(this);
    (this->rotation_tp_).__d.__r = (rep)tVar1.__d.__r;
    if (this->max_files_ != 0) {
      init_filenames_q_(this);
    }
    std::__cxx11::string::~string((string *)&local_a8);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"daily_file_sink: Invalid rotation time in ctor",
             (allocator<char> *)&local_68);
  throw_spdlog_ex(&local_88);
}

Assistant:

daily_file_sink(filename_t base_filename, int rotation_hour, int rotation_minute, bool truncate = false, uint16_t max_files = 0,
        const file_event_handlers &event_handlers = {})
        : base_filename_(std::move(base_filename))
        , rotation_h_(rotation_hour)
        , rotation_m_(rotation_minute)
        , file_helper_{event_handlers}
        , truncate_(truncate)
        , max_files_(max_files)
        , filenames_q_()
    {
        if (rotation_hour < 0 || rotation_hour > 23 || rotation_minute < 0 || rotation_minute > 59)
        {
            throw_spdlog_ex("daily_file_sink: Invalid rotation time in ctor");
        }

        auto now = log_clock::now();
        auto filename = FileNameCalc::calc_filename(base_filename_, now_tm(now));
        file_helper_.open(filename, truncate_);
        rotation_tp_ = next_rotation_tp_();

        if (max_files_ > 0)
        {
            init_filenames_q_();
        }
    }